

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppMVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  char *__s;
  uint uVar7;
  size_t sVar8;
  void *__buf;
  void *__buf_00;
  uint index;
  bool bVar9;
  double dVar10;
  MidiFile midifile;
  double local_d8;
  string local_d0;
  double local_b0;
  uint local_a8;
  uint local_a4;
  MidiFile local_a0;
  
  checkOptions(&options,argc,argv);
  pppMVar1 = &local_a0.m_events.
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a0.m_events.super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"filename","");
  bVar2 = smf::Options::getBoolean(&options,(string *)&local_a0);
  if (local_a0.m_events.
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppMVar1) {
    operator_delete(local_a0.m_events.
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_a0.m_events.super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"minute","");
  bVar3 = smf::Options::getBoolean(&options,(string *)&local_a0);
  if (local_a0.m_events.
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppMVar1) {
    operator_delete(local_a0.m_events.
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  smf::MidiFile::MidiFile(&local_a0);
  local_a4 = smf::Options::getArgCount(&options);
  sVar8 = 1;
  if (1 < (int)local_a4) {
    sVar8 = (size_t)local_a4;
  }
  uVar7 = (uint)sVar8;
  local_d8 = 0.0;
  index = 1;
  local_a8 = uVar7;
  do {
    smf::MidiFile::clear(&local_a0);
    iVar4 = smf::Options::getArgCount(&options);
    if (iVar4 < 1) {
      smf::MidiFile::read(&local_a0,0x12d2e0,__buf,sVar8);
    }
    else {
      psVar5 = smf::Options::getArg_abi_cxx11_(&options,index);
      smf::MidiFile::read(&local_a0,(int)psVar5,__buf_00,sVar8);
    }
    iVar4 = smf::Options::getArgCount(&options);
    if (1 < iVar4) {
      psVar5 = smf::Options::getArg_abi_cxx11_(&options,index);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
    }
    local_b0 = getTotalDuration(&local_a0);
    std::ostream::_M_insert<double>(local_b0);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      minutes_abi_cxx11_(&local_d0,local_b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      __s = smf::MidiFile::getFilename(&local_a0);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d1f8);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar8);
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    local_d8 = local_d8 + local_b0;
    sVar8 = (size_t)(index + 1);
    bVar9 = index != uVar7;
    index = index + 1;
  } while (bVar9);
  if (1 < (int)local_a4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TOTAL\t",6);
    std::ostream::_M_insert<double>(local_d8);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      minutes_abi_cxx11_(&local_d0,local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AVERAGE\t",8);
    dVar10 = (double)(int)local_a8;
    std::ostream::_M_insert<double>(local_d8 / dVar10);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      minutes_abi_cxx11_(&local_d0,local_d8 / dVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  smf::MidiFile::~MidiFile(&local_a0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   checkOptions(options, argc, argv);
	int fileQ  = options.getBoolean("filename");
	int minuteQ = options.getBoolean("minute");

   MidiFile midifile;

	int counter = 0;
	double sum = 0.0;
   int numinputs = options.getArgCount();
   for (int i=0; i < numinputs || i==0; i++) {
      midifile.clear();
      if (options.getArgCount() < 1) {
         midifile.read(cin);
      } else {
         midifile.read(options.getArg(i+1));
      }
      if (options.getArgCount() > 1) {
         cout << options.getArg(i+1) << "\t";
      }
		double duration = getTotalDuration(midifile);
		sum += duration;
		counter++;
      cout << duration;
		if (minuteQ) {
			cout << "\t" << minutes(duration);
		}
		if (fileQ) {
			cout << "\t";
			cout << midifile.getFilename();
		}
      cout << endl;
   }
	if (counter > 1) {
		cout << "TOTAL\t" << sum;
		if (minuteQ) {
			cout << "\t" << minutes(sum);
		}
		cout << endl;
		cout << "AVERAGE\t" << sum/counter;
		if (minuteQ) {
			cout << "\t" << minutes(sum/counter);
		}
		cout << endl;
	}
}